

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecIso.c
# Opt level: O0

void Cec_ManTransformClasses(Gia_Man_t *p)

{
  Gia_Rpr_t *__s;
  int *__s_00;
  int iVar1;
  Gia_Obj_t *pGVar2;
  bool bVar3;
  int local_1c;
  int i;
  Gia_Obj_t *pObj;
  Gia_Man_t *p_local;
  
  if (((p->pReprs != (Gia_Rpr_t *)0x0) && (p->pNexts != (int *)0x0)) && (p->pIso != (int *)0x0)) {
    __s = p->pReprs;
    iVar1 = Gia_ManObjNum(p);
    memset(__s,0,(long)iVar1 << 2);
    __s_00 = p->pNexts;
    iVar1 = Gia_ManObjNum(p);
    memset(__s_00,0,(long)iVar1 << 2);
    local_1c = 0;
    while( true ) {
      bVar3 = false;
      if (local_1c < p->nObjs) {
        pGVar2 = Gia_ManObj(p,local_1c);
        bVar3 = pGVar2 != (Gia_Obj_t *)0x0;
      }
      if (!bVar3) break;
      p->pReprs[local_1c] = (Gia_Rpr_t)((uint)p->pReprs[local_1c] & 0xf0000000 | 0xfffffff);
      if ((p->pIso[local_1c] != 0) && (p->pIso[local_1c] < local_1c)) {
        p->pReprs[local_1c] =
             (Gia_Rpr_t)((uint)p->pReprs[local_1c] & 0xf0000000 | p->pIso[local_1c] & 0xfffffffU);
        p->pNexts[p->pIso[local_1c]] = local_1c;
      }
      local_1c = local_1c + 1;
    }
    return;
  }
  __assert_fail("p->pReprs && p->pNexts && p->pIso",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/cec/cecIso.c"
                ,0x110,"void Cec_ManTransformClasses(Gia_Man_t *)");
}

Assistant:

void Cec_ManTransformClasses( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i;
    assert( p->pReprs && p->pNexts && p->pIso );
    memset( p->pReprs, 0, sizeof(int) * Gia_ManObjNum(p) );
    memset( p->pNexts, 0, sizeof(int) * Gia_ManObjNum(p) );
    Gia_ManForEachObj( p, pObj, i )
    {
        p->pReprs[i].iRepr = GIA_VOID;
        if ( p->pIso[i] && p->pIso[i] < i )
        {
            p->pReprs[i].iRepr = p->pIso[i];
            p->pNexts[p->pIso[i]] = i;
        }
    }
}